

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stats_arena_bins_print(emitter_t *emitter,_Bool mutex,uint i,uint64_t uptime)

{
  tsd_t *tsd;
  long lVar1;
  anon_struct_8_1_803fbc3e_for_cols aVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  emitter_row_t eVar6;
  uint64_t uVar7;
  emitter_col_t *peVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  tsd_t *ptVar12;
  char cVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  emitter_row_t eVar17;
  ulong uVar18;
  long *in_FS_OFFSET;
  size_t miblen_new_2;
  emitter_row_t row;
  emitter_row_t header_row;
  size_t sz_2;
  uint64_t uptime_s;
  undefined4 local_f1c;
  uint32_t nregs;
  uint nbins;
  size_t curslabs;
  size_t curregs;
  uint local_f00;
  uint32_t nshards;
  size_t stats_arenas_mib [7];
  uint64_t batch_pushed_elems;
  uint64_t batch_pushes;
  uint64_t batch_failed_pushes;
  uint64_t batch_pops;
  uint64_t nreslabs;
  uint64_t nflushes;
  uint64_t nfills;
  uint64_t nrequests;
  uint64_t ndalloc;
  uint64_t nmalloc;
  size_t nonfull_slabs;
  uint64_t nslabs;
  ulong local_e58;
  size_t slab_size;
  size_t reg_size;
  size_t page;
  emitter_col_t header_justify_spacer;
  emitter_col_t header_push_elem_ps;
  emitter_col_t col_push_elem_ps;
  emitter_col_t header_push_elem;
  emitter_col_t col_push_elem;
  emitter_col_t header_push_ps;
  emitter_col_t col_push_ps;
  emitter_col_t header_push;
  emitter_col_t col_push;
  emitter_col_t header_failed_push_ps;
  emitter_col_t col_failed_push_ps;
  emitter_col_t header_failed_push;
  emitter_col_t col_failed_push;
  emitter_col_t header_pops_ps;
  emitter_col_t col_pops_ps;
  emitter_col_t header_pops;
  emitter_col_t col_pops;
  emitter_col_t header_nreslabs_ps;
  emitter_col_t col_nreslabs_ps;
  emitter_col_t header_nreslabs;
  emitter_col_t col_nreslabs;
  emitter_col_t header_nslabs;
  emitter_col_t col_nslabs;
  emitter_col_t header_nflushes_ps;
  emitter_col_t col_nflushes_ps;
  emitter_col_t header_nflushes;
  emitter_col_t col_nflushes;
  emitter_col_t header_nfills_ps;
  emitter_col_t col_nfills_ps;
  emitter_col_t header_nfills;
  emitter_col_t col_nfills;
  emitter_col_t header_util;
  emitter_col_t col_util;
  emitter_col_t col_justify_spacer;
  emitter_col_t header_pgs;
  emitter_col_t col_pgs;
  emitter_col_t header_regs;
  emitter_col_t col_regs;
  emitter_col_t header_nonfull_slabs;
  emitter_col_t col_nonfull_slabs;
  emitter_col_t header_curslabs;
  emitter_col_t col_curslabs;
  emitter_col_t header_curregs;
  emitter_col_t col_curregs;
  emitter_col_t header_nshards;
  emitter_col_t col_nshards;
  emitter_col_t header_nrequests_ps;
  emitter_col_t col_nrequests_ps;
  emitter_col_t header_nrequests;
  emitter_col_t col_nrequests;
  emitter_col_t header_ndalloc_ps;
  emitter_col_t col_ndalloc_ps;
  emitter_col_t header_ndalloc;
  emitter_col_t col_ndalloc;
  emitter_col_t header_nmalloc_ps;
  emitter_col_t col_nmalloc_ps;
  emitter_col_t header_nmalloc;
  emitter_col_t col_nmalloc;
  emitter_col_t header_allocated;
  emitter_col_t col_allocated;
  size_t arenas_bin_mib [7];
  emitter_col_t col_mutex32 [1];
  emitter_col_t col_mutex64 [11];
  emitter_col_t col_ind;
  emitter_col_t header_size;
  emitter_col_t col_size;
  emitter_col_t header_mutex32 [1];
  emitter_col_t header_ind;
  emitter_col_t header_mutex64 [11];
  
  local_f1c = (undefined4)CONCAT71(in_register_00000031,mutex);
  col_mutex64[0].justify = 8;
  col_mutex64[0].width = 0;
  iVar9 = duckdb_je_mallctl("arenas.page",&page,(size_t *)col_mutex64,(void *)0x0,0);
  if (iVar9 == 0) {
    col_mutex64[0].justify = 4;
    col_mutex64[0].width = 0;
    iVar9 = duckdb_je_mallctl("arenas.nbins",&nbins,(size_t *)col_mutex64,(void *)0x0,0);
    if (iVar9 == 0) {
      col_ind.link.qre_next = &col_size;
      col_size.justify = emitter_justify_right;
      col_size.width = 0x14;
      col_size.type = emitter_type_size;
      header_ind.link.qre_next = &header_size;
      header_size.justify = emitter_justify_right;
      header_size.width = 0x14;
      header_size.type = emitter_type_title;
      header_size.field_3.str_val = "size";
      col_size.link.qre_next = &col_ind;
      col_ind.justify = emitter_justify_right;
      col_ind.width = 4;
      col_ind.type = emitter_type_unsigned;
      header_size.link.qre_next = &header_ind;
      header_ind.justify = emitter_justify_right;
      header_ind.width = 4;
      header_ind.field_3.str_val = "ind";
      col_allocated.link.qre_next = &col_allocated;
      col_allocated.link.qre_prev = &col_allocated;
      col_size.link.qre_prev = col_size.link.qre_next;
      if (col_ind.link.qre_next != (emitter_col_t *)0x0) {
        col_allocated.link.qre_next = col_ind.link.qre_next;
        col_allocated.link.qre_prev = col_size.link.qre_next;
        col_size.link.qre_prev = &col_allocated;
      }
      col_allocated.justify = emitter_justify_right;
      col_allocated.width = 0xd;
      col_allocated.type = emitter_type_size;
      peVar8 = &header_allocated;
      header_allocated.link.qre_prev = &header_allocated;
      header_size.link.qre_prev = header_size.link.qre_next;
      if (header_ind.link.qre_next != (emitter_col_t *)0x0) {
        header_allocated.link.qre_prev = header_allocated.link.qre_next;
        ((header_allocated.link.qre_next)->link).qre_next = &header_allocated;
        peVar8 = header_size.link.qre_next;
        header_size.link.qre_prev = &header_allocated;
      }
      header_allocated.link.qre_next = peVar8;
      header_allocated.justify = emitter_justify_right;
      header_allocated.width = 0xd;
      header_allocated.type = emitter_type_title;
      header_allocated.field_3.str_val = "allocated";
      col_nmalloc.link.qre_prev = &col_nmalloc;
      col_ind.link.qre_prev = col_ind.link.qre_next;
      if (col_allocated.link.qre_next != (emitter_col_t *)0x0) {
        col_nmalloc.link.qre_prev = ((col_allocated.link.qre_next)->link).qre_prev;
        ((col_allocated.link.qre_next)->link).qre_prev = &col_nmalloc;
        ((((col_allocated.link.qre_next)->link).qre_prev)->link).qre_next =
             col_allocated.link.qre_next;
        ((col_nmalloc.link.qre_prev)->link).qre_next = &col_nmalloc;
      }
      col_nmalloc.link.qre_next = col_nmalloc.link.qre_prev;
      col_nmalloc.justify = emitter_justify_right;
      col_nmalloc.width = 0xd;
      col_nmalloc.type = emitter_type_uint64;
      header_nmalloc.link.qre_prev = &header_nmalloc;
      header_ind.type = header_size.type;
      header_ind.link.qre_prev = header_ind.link.qre_next;
      if (header_allocated.link.qre_next != (emitter_col_t *)0x0) {
        header_nmalloc.link.qre_prev = ((header_allocated.link.qre_next)->link).qre_prev;
        ((header_allocated.link.qre_next)->link).qre_prev = &header_nmalloc;
        ((((header_allocated.link.qre_next)->link).qre_prev)->link).qre_next =
             header_allocated.link.qre_next;
        ((header_nmalloc.link.qre_prev)->link).qre_next = &header_nmalloc;
      }
      header_nmalloc.link.qre_next = header_nmalloc.link.qre_prev;
      header_nmalloc.justify = emitter_justify_right;
      header_nmalloc.width = 0xd;
      header_nmalloc.type = emitter_type_title;
      header_nmalloc.field_3.str_val = "nmalloc";
      col_nmalloc_ps.link.qre_prev = &col_nmalloc_ps;
      if (col_nmalloc.link.qre_prev != (emitter_col_t *)0x0) {
        col_nmalloc_ps.link.qre_prev = ((col_nmalloc.link.qre_prev)->link).qre_prev;
        ((col_nmalloc.link.qre_prev)->link).qre_prev = &col_nmalloc_ps;
        ((((col_nmalloc.link.qre_next)->link).qre_prev)->link).qre_next = col_nmalloc.link.qre_next;
        ((col_nmalloc_ps.link.qre_prev)->link).qre_next = &col_nmalloc_ps;
      }
      col_nmalloc_ps.link.qre_next = col_nmalloc_ps.link.qre_prev;
      col_nmalloc_ps.justify = emitter_justify_right;
      col_nmalloc_ps.width = 8;
      col_nmalloc_ps.type = emitter_type_uint64;
      header_nmalloc_ps.link.qre_prev = &header_nmalloc_ps;
      if (header_nmalloc.link.qre_prev != (emitter_col_t *)0x0) {
        header_nmalloc_ps.link.qre_prev = ((header_nmalloc.link.qre_prev)->link).qre_prev;
        ((header_nmalloc.link.qre_prev)->link).qre_prev = &header_nmalloc_ps;
        ((((header_nmalloc.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nmalloc.link.qre_next;
        ((header_nmalloc_ps.link.qre_prev)->link).qre_next = &header_nmalloc_ps;
      }
      header_nmalloc_ps.link.qre_next = header_nmalloc_ps.link.qre_prev;
      header_nmalloc_ps.justify = emitter_justify_right;
      header_nmalloc_ps.width = 8;
      header_nmalloc_ps.type = emitter_type_title;
      header_nmalloc_ps.field_3.str_val = "(#/sec)";
      col_ndalloc.link.qre_prev = &col_ndalloc;
      if (col_nmalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_ndalloc.link.qre_prev = ((col_nmalloc_ps.link.qre_prev)->link).qre_prev;
        ((col_nmalloc_ps.link.qre_prev)->link).qre_prev = &col_ndalloc;
        ((((col_nmalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nmalloc_ps.link.qre_next;
        ((col_ndalloc.link.qre_prev)->link).qre_next = &col_ndalloc;
      }
      col_ndalloc.link.qre_next = col_ndalloc.link.qre_prev;
      col_ndalloc.justify = emitter_justify_right;
      col_ndalloc.width = 0xd;
      col_ndalloc.type = emitter_type_uint64;
      header_ndalloc.link.qre_prev = &header_ndalloc;
      if (header_nmalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_ndalloc.link.qre_prev = ((header_nmalloc_ps.link.qre_prev)->link).qre_prev;
        ((header_nmalloc_ps.link.qre_prev)->link).qre_prev = &header_ndalloc;
        ((((header_nmalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nmalloc_ps.link.qre_next;
        ((header_ndalloc.link.qre_prev)->link).qre_next = &header_ndalloc;
      }
      header_ndalloc.link.qre_next = header_ndalloc.link.qre_prev;
      header_ndalloc.justify = emitter_justify_right;
      header_ndalloc.width = 0xd;
      header_ndalloc.type = emitter_type_title;
      header_ndalloc.field_3.str_val = "ndalloc";
      col_ndalloc_ps.link.qre_prev = &col_ndalloc_ps;
      if (col_ndalloc.link.qre_prev != (emitter_col_t *)0x0) {
        col_ndalloc_ps.link.qre_prev = ((col_ndalloc.link.qre_prev)->link).qre_prev;
        ((col_ndalloc.link.qre_prev)->link).qre_prev = &col_ndalloc_ps;
        ((((col_ndalloc.link.qre_next)->link).qre_prev)->link).qre_next = col_ndalloc.link.qre_next;
        ((col_ndalloc_ps.link.qre_prev)->link).qre_next = &col_ndalloc_ps;
      }
      col_ndalloc_ps.link.qre_next = col_ndalloc_ps.link.qre_prev;
      col_ndalloc_ps.justify = emitter_justify_right;
      col_ndalloc_ps.width = 8;
      col_ndalloc_ps.type = emitter_type_uint64;
      header_ndalloc_ps.link.qre_prev = &header_ndalloc_ps;
      if (header_ndalloc.link.qre_prev != (emitter_col_t *)0x0) {
        header_ndalloc_ps.link.qre_prev = ((header_ndalloc.link.qre_prev)->link).qre_prev;
        ((header_ndalloc.link.qre_prev)->link).qre_prev = &header_ndalloc_ps;
        ((((header_ndalloc.link.qre_next)->link).qre_prev)->link).qre_next =
             header_ndalloc.link.qre_next;
        ((header_ndalloc_ps.link.qre_prev)->link).qre_next = &header_ndalloc_ps;
      }
      header_ndalloc_ps.link.qre_next = header_ndalloc_ps.link.qre_prev;
      header_ndalloc_ps.justify = emitter_justify_right;
      header_ndalloc_ps.width = 8;
      header_ndalloc_ps.type = emitter_type_title;
      header_ndalloc_ps.field_3.str_val = "(#/sec)";
      col_nrequests.link.qre_prev = &col_nrequests;
      if (col_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_nrequests.link.qre_prev = ((col_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((col_ndalloc_ps.link.qre_prev)->link).qre_prev = &col_nrequests;
        ((((col_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_ndalloc_ps.link.qre_next;
        ((col_nrequests.link.qre_prev)->link).qre_next = &col_nrequests;
      }
      col_nrequests.link.qre_next = col_nrequests.link.qre_prev;
      col_nrequests.justify = emitter_justify_right;
      col_nrequests.width = 0xd;
      col_nrequests.type = emitter_type_uint64;
      header_nrequests.link.qre_prev = &header_nrequests;
      if (header_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_nrequests.link.qre_prev = ((header_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((header_ndalloc_ps.link.qre_prev)->link).qre_prev = &header_nrequests;
        ((((header_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_ndalloc_ps.link.qre_next;
        ((header_nrequests.link.qre_prev)->link).qre_next = &header_nrequests;
      }
      header_nrequests.link.qre_next = header_nrequests.link.qre_prev;
      header_nrequests.justify = emitter_justify_right;
      header_nrequests.width = 0xd;
      header_nrequests.type = emitter_type_title;
      header_nrequests.field_3.str_val = "nrequests";
      col_nrequests_ps.link.qre_prev = &col_nrequests_ps;
      if (col_nrequests.link.qre_prev != (emitter_col_t *)0x0) {
        col_nrequests_ps.link.qre_prev = ((col_nrequests.link.qre_prev)->link).qre_prev;
        ((col_nrequests.link.qre_prev)->link).qre_prev = &col_nrequests_ps;
        ((((col_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests.link.qre_next;
        ((col_nrequests_ps.link.qre_prev)->link).qre_next = &col_nrequests_ps;
      }
      col_nrequests_ps.link.qre_next = col_nrequests_ps.link.qre_prev;
      col_nrequests_ps.justify = emitter_justify_right;
      col_nrequests_ps.width = 10;
      col_nrequests_ps.type = emitter_type_uint64;
      header_nrequests_ps.link.qre_prev = &header_nrequests_ps;
      if (header_nrequests.link.qre_prev != (emitter_col_t *)0x0) {
        header_nrequests_ps.link.qre_prev = ((header_nrequests.link.qre_prev)->link).qre_prev;
        ((header_nrequests.link.qre_prev)->link).qre_prev = &header_nrequests_ps;
        ((((header_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests.link.qre_next;
        ((header_nrequests_ps.link.qre_prev)->link).qre_next = &header_nrequests_ps;
      }
      header_nrequests_ps.link.qre_next = header_nrequests_ps.link.qre_prev;
      header_nrequests_ps.justify = emitter_justify_right;
      header_nrequests_ps.width = 10;
      header_nrequests_ps.type = emitter_type_title;
      header_nrequests_ps.field_3.str_val = "(#/sec)";
      col_nshards.link.qre_prev = &col_nshards;
      if (col_nrequests_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_nshards.link.qre_prev = ((col_nrequests_ps.link.qre_prev)->link).qre_prev;
        ((col_nrequests_ps.link.qre_prev)->link).qre_prev = &col_nshards;
        ((((col_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests_ps.link.qre_next;
        ((col_nshards.link.qre_prev)->link).qre_next = &col_nshards;
      }
      col_nshards.link.qre_next = col_nshards.link.qre_prev;
      col_nshards.justify = emitter_justify_right;
      col_nshards.width = 9;
      col_nshards.type = emitter_type_unsigned;
      header_nshards.link.qre_prev = &header_nshards;
      if (header_nrequests_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_nshards.link.qre_prev = ((header_nrequests_ps.link.qre_prev)->link).qre_prev;
        ((header_nrequests_ps.link.qre_prev)->link).qre_prev = &header_nshards;
        ((((header_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests_ps.link.qre_next;
        ((header_nshards.link.qre_prev)->link).qre_next = &header_nshards;
      }
      header_nshards.link.qre_next = header_nshards.link.qre_prev;
      header_nshards.justify = emitter_justify_right;
      header_nshards.width = 9;
      header_nshards.type = emitter_type_title;
      header_nshards.field_3.str_val = "nshards";
      col_curregs.link.qre_prev = &col_curregs;
      if (col_nshards.link.qre_prev != (emitter_col_t *)0x0) {
        col_curregs.link.qre_prev = ((col_nshards.link.qre_prev)->link).qre_prev;
        ((col_nshards.link.qre_prev)->link).qre_prev = &col_curregs;
        ((((col_nshards.link.qre_next)->link).qre_prev)->link).qre_next = col_nshards.link.qre_next;
        ((col_curregs.link.qre_prev)->link).qre_next = &col_curregs;
      }
      col_curregs.link.qre_next = col_curregs.link.qre_prev;
      col_curregs.justify = emitter_justify_right;
      col_curregs.width = 0xd;
      col_curregs.type = emitter_type_size;
      header_curregs.link.qre_prev = &header_curregs;
      if (header_nshards.link.qre_prev != (emitter_col_t *)0x0) {
        header_curregs.link.qre_prev = ((header_nshards.link.qre_prev)->link).qre_prev;
        ((header_nshards.link.qre_prev)->link).qre_prev = &header_curregs;
        ((((header_nshards.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nshards.link.qre_next;
        ((header_curregs.link.qre_prev)->link).qre_next = &header_curregs;
      }
      header_curregs.link.qre_next = header_curregs.link.qre_prev;
      header_curregs.justify = emitter_justify_right;
      header_curregs.width = 0xd;
      header_curregs.type = emitter_type_title;
      header_curregs.field_3.str_val = "curregs";
      col_curslabs.link.qre_prev = &col_curslabs;
      if (col_curregs.link.qre_prev != (emitter_col_t *)0x0) {
        col_curslabs.link.qre_prev = ((col_curregs.link.qre_prev)->link).qre_prev;
        ((col_curregs.link.qre_prev)->link).qre_prev = &col_curslabs;
        ((((col_curregs.link.qre_next)->link).qre_prev)->link).qre_next = col_curregs.link.qre_next;
        ((col_curslabs.link.qre_prev)->link).qre_next = &col_curslabs;
      }
      col_curslabs.link.qre_next = col_curslabs.link.qre_prev;
      col_curslabs.justify = emitter_justify_right;
      col_curslabs.width = 0xd;
      col_curslabs.type = emitter_type_size;
      header_curslabs.link.qre_prev = &header_curslabs;
      if (header_curregs.link.qre_prev != (emitter_col_t *)0x0) {
        header_curslabs.link.qre_prev = ((header_curregs.link.qre_prev)->link).qre_prev;
        ((header_curregs.link.qre_prev)->link).qre_prev = &header_curslabs;
        ((((header_curregs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_curregs.link.qre_next;
        ((header_curslabs.link.qre_prev)->link).qre_next = &header_curslabs;
      }
      header_curslabs.link.qre_next = header_curslabs.link.qre_prev;
      header_curslabs.justify = emitter_justify_right;
      header_curslabs.width = 0xd;
      header_curslabs.type = emitter_type_title;
      header_curslabs.field_3.str_val = "curslabs";
      col_nonfull_slabs.link.qre_prev = &col_nonfull_slabs;
      if (col_curslabs.link.qre_prev != (emitter_col_t *)0x0) {
        col_nonfull_slabs.link.qre_prev = ((col_curslabs.link.qre_prev)->link).qre_prev;
        ((col_curslabs.link.qre_prev)->link).qre_prev = &col_nonfull_slabs;
        ((((col_curslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             col_curslabs.link.qre_next;
        ((col_nonfull_slabs.link.qre_prev)->link).qre_next = &col_nonfull_slabs;
      }
      col_nonfull_slabs.link.qre_next = col_nonfull_slabs.link.qre_prev;
      col_nonfull_slabs.justify = emitter_justify_right;
      col_nonfull_slabs.width = 0xf;
      col_nonfull_slabs.type = emitter_type_size;
      header_nonfull_slabs.link.qre_prev = &header_nonfull_slabs;
      if (header_curslabs.link.qre_prev != (emitter_col_t *)0x0) {
        header_nonfull_slabs.link.qre_prev = ((header_curslabs.link.qre_prev)->link).qre_prev;
        ((header_curslabs.link.qre_prev)->link).qre_prev = &header_nonfull_slabs;
        ((((header_curslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_curslabs.link.qre_next;
        ((header_nonfull_slabs.link.qre_prev)->link).qre_next = &header_nonfull_slabs;
      }
      header_nonfull_slabs.link.qre_next = header_nonfull_slabs.link.qre_prev;
      header_nonfull_slabs.justify = emitter_justify_right;
      header_nonfull_slabs.width = 0xf;
      header_nonfull_slabs.type = emitter_type_title;
      header_nonfull_slabs.field_3.str_val = "nonfull_slabs";
      col_regs.link.qre_prev = &col_regs;
      if (col_nonfull_slabs.link.qre_prev != (emitter_col_t *)0x0) {
        col_regs.link.qre_prev = ((col_nonfull_slabs.link.qre_prev)->link).qre_prev;
        ((col_nonfull_slabs.link.qre_prev)->link).qre_prev = &col_regs;
        ((((col_nonfull_slabs.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nonfull_slabs.link.qre_next;
        ((col_regs.link.qre_prev)->link).qre_next = &col_regs;
      }
      col_regs.link.qre_next = col_regs.link.qre_prev;
      col_regs.justify = emitter_justify_right;
      col_regs.width = 5;
      col_regs.type = emitter_type_unsigned;
      header_regs.link.qre_prev = &header_regs;
      if (header_nonfull_slabs.link.qre_prev != (emitter_col_t *)0x0) {
        header_regs.link.qre_prev = ((header_nonfull_slabs.link.qre_prev)->link).qre_prev;
        ((header_nonfull_slabs.link.qre_prev)->link).qre_prev = &header_regs;
        ((((header_nonfull_slabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nonfull_slabs.link.qre_next;
        ((header_regs.link.qre_prev)->link).qre_next = &header_regs;
      }
      header_regs.link.qre_next = header_regs.link.qre_prev;
      header_regs.justify = emitter_justify_right;
      header_regs.width = 5;
      header_regs.type = emitter_type_title;
      header_regs.field_3.str_val = "regs";
      col_pgs.link.qre_prev = &col_pgs;
      if (col_regs.link.qre_prev != (emitter_col_t *)0x0) {
        col_pgs.link.qre_prev = ((col_regs.link.qre_prev)->link).qre_prev;
        ((col_regs.link.qre_prev)->link).qre_prev = &col_pgs;
        ((((col_regs.link.qre_next)->link).qre_prev)->link).qre_next = col_regs.link.qre_next;
        ((col_pgs.link.qre_prev)->link).qre_next = &col_pgs;
      }
      col_pgs.link.qre_next = col_pgs.link.qre_prev;
      col_pgs.justify = emitter_justify_right;
      col_pgs.width = 4;
      col_pgs.type = emitter_type_size;
      header_pgs.link.qre_prev = &header_pgs;
      if (header_regs.link.qre_prev != (emitter_col_t *)0x0) {
        header_pgs.link.qre_prev = ((header_regs.link.qre_prev)->link).qre_prev;
        ((header_regs.link.qre_prev)->link).qre_prev = &header_pgs;
        ((((header_regs.link.qre_next)->link).qre_prev)->link).qre_next = header_regs.link.qre_next;
        ((header_pgs.link.qre_prev)->link).qre_next = &header_pgs;
      }
      header_pgs.link.qre_next = header_pgs.link.qre_prev;
      header_pgs.justify = emitter_justify_right;
      header_pgs.width = 4;
      header_pgs.type = emitter_type_title;
      header_pgs.field_3.str_val = "pgs";
      col_justify_spacer.link.qre_prev = &col_justify_spacer;
      if (col_pgs.link.qre_prev != (emitter_col_t *)0x0) {
        col_justify_spacer.link.qre_prev = ((col_pgs.link.qre_prev)->link).qre_prev;
        ((col_pgs.link.qre_prev)->link).qre_prev = &col_justify_spacer;
        ((((col_pgs.link.qre_next)->link).qre_prev)->link).qre_next = col_pgs.link.qre_next;
        ((col_justify_spacer.link.qre_prev)->link).qre_next = &col_justify_spacer;
      }
      col_justify_spacer.link.qre_next = col_justify_spacer.link.qre_prev;
      col_justify_spacer.justify = emitter_justify_right;
      col_justify_spacer.width = 1;
      col_justify_spacer.type = emitter_type_title;
      header_justify_spacer.link.qre_prev = &header_justify_spacer;
      if (header_pgs.link.qre_prev != (emitter_col_t *)0x0) {
        header_justify_spacer.link.qre_prev = ((header_pgs.link.qre_prev)->link).qre_prev;
        ((header_pgs.link.qre_prev)->link).qre_prev = &header_justify_spacer;
        ((((header_pgs.link.qre_next)->link).qre_prev)->link).qre_next = header_pgs.link.qre_next;
        ((header_justify_spacer.link.qre_prev)->link).qre_next = &header_justify_spacer;
      }
      header_justify_spacer.link.qre_next = header_justify_spacer.link.qre_prev;
      header_justify_spacer.justify = emitter_justify_right;
      header_justify_spacer.width = 1;
      header_justify_spacer.type = emitter_type_title;
      col_util.link.qre_prev = &col_util;
      if (col_justify_spacer.link.qre_prev != (emitter_col_t *)0x0) {
        col_util.link.qre_prev = ((col_justify_spacer.link.qre_prev)->link).qre_prev;
        ((col_justify_spacer.link.qre_prev)->link).qre_prev = &col_util;
        ((((col_justify_spacer.link.qre_next)->link).qre_prev)->link).qre_next =
             col_justify_spacer.link.qre_next;
        ((col_util.link.qre_prev)->link).qre_next = &col_util;
      }
      peVar8 = col_util.link.qre_prev;
      col_util.justify = emitter_justify_right;
      col_util.width = 6;
      col_util.type = emitter_type_title;
      header_util.link.qre_next = &header_util;
      header_util.link.qre_prev = &header_util;
      col_util.link.qre_next = col_util.link.qre_prev;
      if (header_justify_spacer.link.qre_prev != (emitter_col_t *)0x0) {
        header_util.link.qre_next = ((header_justify_spacer.link.qre_prev)->link).qre_prev;
        ((header_justify_spacer.link.qre_prev)->link).qre_prev = &header_util;
        header_util.link.qre_prev = ((header_util.link.qre_prev)->link).qre_next;
        ((((header_justify_spacer.link.qre_next)->link).qre_prev)->link).qre_next =
             header_justify_spacer.link.qre_next;
        ((header_util.link.qre_prev)->link).qre_next = &header_util;
      }
      header_util.justify = emitter_justify_right;
      header_util.width = 6;
      header_util.type = emitter_type_title;
      header_util.field_3.str_val = "util";
      col_nfills.link.qre_prev = &col_nfills;
      if (peVar8 != (emitter_col_t *)0x0) {
        col_nfills.link.qre_prev = (peVar8->link).qre_prev;
        (peVar8->link).qre_prev = &col_nfills;
        (((peVar8->link).qre_prev)->link).qre_next = peVar8;
        ((col_nfills.link.qre_prev)->link).qre_next = &col_nfills;
      }
      col_nfills.link.qre_next = col_nfills.link.qre_prev;
      col_nfills.justify = emitter_justify_right;
      col_nfills.width = 0xd;
      col_nfills.type = emitter_type_uint64;
      header_nfills.link.qre_prev = &header_nfills;
      if (header_util.link.qre_next != (emitter_col_t *)0x0) {
        header_nfills.link.qre_prev = ((header_util.link.qre_next)->link).qre_prev;
        ((header_util.link.qre_next)->link).qre_prev = &header_nfills;
        ((((header_util.link.qre_next)->link).qre_prev)->link).qre_next = header_util.link.qre_next;
        ((header_nfills.link.qre_prev)->link).qre_next = &header_nfills;
      }
      header_nfills.link.qre_next = header_nfills.link.qre_prev;
      header_nfills.justify = emitter_justify_right;
      header_nfills.width = 0xd;
      header_nfills.type = emitter_type_title;
      header_nfills.field_3.str_val = "nfills";
      col_nfills_ps.link.qre_prev = &col_nfills_ps;
      if (col_nfills.link.qre_prev != (emitter_col_t *)0x0) {
        col_nfills_ps.link.qre_prev = ((col_nfills.link.qre_prev)->link).qre_prev;
        ((col_nfills.link.qre_prev)->link).qre_prev = &col_nfills_ps;
        ((((col_nfills.link.qre_next)->link).qre_prev)->link).qre_next = col_nfills.link.qre_next;
        ((col_nfills_ps.link.qre_prev)->link).qre_next = &col_nfills_ps;
      }
      col_nfills_ps.link.qre_next = col_nfills_ps.link.qre_prev;
      col_nfills_ps.justify = emitter_justify_right;
      col_nfills_ps.width = 8;
      col_nfills_ps.type = emitter_type_uint64;
      header_nfills_ps.link.qre_prev = &header_nfills_ps;
      if (header_nfills.link.qre_prev != (emitter_col_t *)0x0) {
        header_nfills_ps.link.qre_prev = ((header_nfills.link.qre_prev)->link).qre_prev;
        ((header_nfills.link.qre_prev)->link).qre_prev = &header_nfills_ps;
        ((((header_nfills.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nfills.link.qre_next;
        ((header_nfills_ps.link.qre_prev)->link).qre_next = &header_nfills_ps;
      }
      header_nfills_ps.link.qre_next = header_nfills_ps.link.qre_prev;
      header_nfills_ps.justify = emitter_justify_right;
      header_nfills_ps.width = 8;
      header_nfills_ps.type = emitter_type_title;
      header_nfills_ps.field_3.str_val = "(#/sec)";
      col_nflushes.link.qre_prev = &col_nflushes;
      if (col_nfills_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_nflushes.link.qre_prev = ((col_nfills_ps.link.qre_prev)->link).qre_prev;
        ((col_nfills_ps.link.qre_prev)->link).qre_prev = &col_nflushes;
        ((((col_nfills_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nfills_ps.link.qre_next;
        ((col_nflushes.link.qre_prev)->link).qre_next = &col_nflushes;
      }
      col_nflushes.link.qre_next = col_nflushes.link.qre_prev;
      col_nflushes.justify = emitter_justify_right;
      col_nflushes.width = 0xd;
      col_nflushes.type = emitter_type_uint64;
      header_nflushes.link.qre_prev = &header_nflushes;
      if (header_nfills_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_nflushes.link.qre_prev = ((header_nfills_ps.link.qre_prev)->link).qre_prev;
        ((header_nfills_ps.link.qre_prev)->link).qre_prev = &header_nflushes;
        ((((header_nfills_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nfills_ps.link.qre_next;
        ((header_nflushes.link.qre_prev)->link).qre_next = &header_nflushes;
      }
      header_nflushes.link.qre_next = header_nflushes.link.qre_prev;
      header_nflushes.justify = emitter_justify_right;
      header_nflushes.width = 0xd;
      header_nflushes.type = emitter_type_title;
      header_nflushes.field_3.str_val = "nflushes";
      col_nflushes_ps.link.qre_prev = &col_nflushes_ps;
      if (col_nflushes.link.qre_prev != (emitter_col_t *)0x0) {
        col_nflushes_ps.link.qre_prev = ((col_nflushes.link.qre_prev)->link).qre_prev;
        ((col_nflushes.link.qre_prev)->link).qre_prev = &col_nflushes_ps;
        ((((col_nflushes.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nflushes.link.qre_next;
        ((col_nflushes_ps.link.qre_prev)->link).qre_next = &col_nflushes_ps;
      }
      col_nflushes_ps.link.qre_next = col_nflushes_ps.link.qre_prev;
      col_nflushes_ps.justify = emitter_justify_right;
      col_nflushes_ps.width = 8;
      col_nflushes_ps.type = emitter_type_uint64;
      header_nflushes_ps.link.qre_prev = &header_nflushes_ps;
      if (header_nflushes.link.qre_prev != (emitter_col_t *)0x0) {
        header_nflushes_ps.link.qre_prev = ((header_nflushes.link.qre_prev)->link).qre_prev;
        ((header_nflushes.link.qre_prev)->link).qre_prev = &header_nflushes_ps;
        ((((header_nflushes.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nflushes.link.qre_next;
        ((header_nflushes_ps.link.qre_prev)->link).qre_next = &header_nflushes_ps;
      }
      header_nflushes_ps.link.qre_next = header_nflushes_ps.link.qre_prev;
      header_nflushes_ps.justify = emitter_justify_right;
      header_nflushes_ps.width = 8;
      header_nflushes_ps.type = emitter_type_title;
      header_nflushes_ps.field_3.str_val = "(#/sec)";
      col_nslabs.link.qre_prev = &col_nslabs;
      if (col_nflushes_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_nslabs.link.qre_prev = ((col_nflushes_ps.link.qre_prev)->link).qre_prev;
        ((col_nflushes_ps.link.qre_prev)->link).qre_prev = &col_nslabs;
        ((((col_nflushes_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nflushes_ps.link.qre_next;
        ((col_nslabs.link.qre_prev)->link).qre_next = &col_nslabs;
      }
      col_nslabs.link.qre_next = col_nslabs.link.qre_prev;
      col_nslabs.justify = emitter_justify_right;
      col_nslabs.width = 0xd;
      col_nslabs.type = emitter_type_uint64;
      header_nslabs.link.qre_prev = &header_nslabs;
      if (header_nflushes_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_nslabs.link.qre_prev = ((header_nflushes_ps.link.qre_prev)->link).qre_prev;
        ((header_nflushes_ps.link.qre_prev)->link).qre_prev = &header_nslabs;
        ((((header_nflushes_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nflushes_ps.link.qre_next;
        ((header_nslabs.link.qre_prev)->link).qre_next = &header_nslabs;
      }
      header_nslabs.link.qre_next = header_nslabs.link.qre_prev;
      header_nslabs.justify = emitter_justify_right;
      header_nslabs.width = 0xd;
      header_nslabs.type = emitter_type_title;
      header_nslabs.field_3.str_val = "nslabs";
      col_nreslabs.link.qre_prev = &col_nreslabs;
      if (col_nslabs.link.qre_prev != (emitter_col_t *)0x0) {
        col_nreslabs.link.qre_prev = ((col_nslabs.link.qre_prev)->link).qre_prev;
        ((col_nslabs.link.qre_prev)->link).qre_prev = &col_nreslabs;
        ((((col_nslabs.link.qre_next)->link).qre_prev)->link).qre_next = col_nslabs.link.qre_next;
        ((col_nreslabs.link.qre_prev)->link).qre_next = &col_nreslabs;
      }
      col_nreslabs.link.qre_next = col_nreslabs.link.qre_prev;
      col_nreslabs.justify = emitter_justify_right;
      col_nreslabs.width = 0xd;
      col_nreslabs.type = emitter_type_uint64;
      header_nreslabs.link.qre_prev = &header_nreslabs;
      if (header_nslabs.link.qre_prev != (emitter_col_t *)0x0) {
        header_nreslabs.link.qre_prev = ((header_nslabs.link.qre_prev)->link).qre_prev;
        ((header_nslabs.link.qre_prev)->link).qre_prev = &header_nreslabs;
        ((((header_nslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nslabs.link.qre_next;
        ((header_nreslabs.link.qre_prev)->link).qre_next = &header_nreslabs;
      }
      header_nreslabs.link.qre_next = header_nreslabs.link.qre_prev;
      header_nreslabs.justify = emitter_justify_right;
      header_nreslabs.width = 0xd;
      header_nreslabs.type = emitter_type_title;
      header_nreslabs.field_3.str_val = "nreslabs";
      col_nreslabs_ps.link.qre_prev = &col_nreslabs_ps;
      if (col_nreslabs.link.qre_prev != (emitter_col_t *)0x0) {
        col_nreslabs_ps.link.qre_prev = ((col_nreslabs.link.qre_prev)->link).qre_prev;
        ((col_nreslabs.link.qre_prev)->link).qre_prev = &col_nreslabs_ps;
        ((((col_nreslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nreslabs.link.qre_next;
        ((col_nreslabs_ps.link.qre_prev)->link).qre_next = &col_nreslabs_ps;
      }
      col_nreslabs_ps.link.qre_next = col_nreslabs_ps.link.qre_prev;
      col_nreslabs_ps.justify = emitter_justify_right;
      col_nreslabs_ps.width = 8;
      col_nreslabs_ps.type = emitter_type_uint64;
      header_nreslabs_ps.link.qre_prev = &header_nreslabs_ps;
      if (header_nreslabs.link.qre_prev != (emitter_col_t *)0x0) {
        header_nreslabs_ps.link.qre_prev = ((header_nreslabs.link.qre_prev)->link).qre_prev;
        ((header_nreslabs.link.qre_prev)->link).qre_prev = &header_nreslabs_ps;
        ((((header_nreslabs.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nreslabs.link.qre_next;
        ((header_nreslabs_ps.link.qre_prev)->link).qre_next = &header_nreslabs_ps;
      }
      header_nreslabs_ps.link.qre_next = header_nreslabs_ps.link.qre_prev;
      header_nreslabs_ps.justify = emitter_justify_right;
      header_nreslabs_ps.width = 8;
      header_nreslabs_ps.type = emitter_type_title;
      header_nreslabs_ps.field_3.str_val = "(#/sec)";
      col_pops.link.qre_prev = &col_pops;
      if (col_nreslabs_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_pops.link.qre_prev = ((col_nreslabs_ps.link.qre_prev)->link).qre_prev;
        ((col_nreslabs_ps.link.qre_prev)->link).qre_prev = &col_pops;
        ((((col_nreslabs_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nreslabs_ps.link.qre_next;
        ((col_pops.link.qre_prev)->link).qre_next = &col_pops;
      }
      col_pops.link.qre_next = col_pops.link.qre_prev;
      col_pops.justify = emitter_justify_right;
      col_pops.width = 10;
      col_pops.type = emitter_type_uint64;
      header_pops.link.qre_prev = &header_pops;
      if (header_nreslabs_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_pops.link.qre_prev = ((header_nreslabs_ps.link.qre_prev)->link).qre_prev;
        ((header_nreslabs_ps.link.qre_prev)->link).qre_prev = &header_pops;
        ((((header_nreslabs_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nreslabs_ps.link.qre_next;
        ((header_pops.link.qre_prev)->link).qre_next = &header_pops;
      }
      header_pops.link.qre_next = header_pops.link.qre_prev;
      header_pops.justify = emitter_justify_right;
      header_pops.width = 10;
      header_pops.type = emitter_type_title;
      header_pops.field_3.str_val = "pops";
      col_pops_ps.link.qre_prev = &col_pops_ps;
      if (col_pops.link.qre_prev != (emitter_col_t *)0x0) {
        col_pops_ps.link.qre_prev = ((col_pops.link.qre_prev)->link).qre_prev;
        ((col_pops.link.qre_prev)->link).qre_prev = &col_pops_ps;
        ((((col_pops.link.qre_next)->link).qre_prev)->link).qre_next = col_pops.link.qre_next;
        ((col_pops_ps.link.qre_prev)->link).qre_next = &col_pops_ps;
      }
      col_pops_ps.link.qre_next = col_pops_ps.link.qre_prev;
      col_pops_ps.justify = emitter_justify_right;
      col_pops_ps.width = 8;
      col_pops_ps.type = emitter_type_uint64;
      header_pops_ps.link.qre_prev = &header_pops_ps;
      if (header_pops.link.qre_prev != (emitter_col_t *)0x0) {
        header_pops_ps.link.qre_prev = ((header_pops.link.qre_prev)->link).qre_prev;
        ((header_pops.link.qre_prev)->link).qre_prev = &header_pops_ps;
        ((((header_pops.link.qre_next)->link).qre_prev)->link).qre_next = header_pops.link.qre_next;
        ((header_pops_ps.link.qre_prev)->link).qre_next = &header_pops_ps;
      }
      header_pops_ps.link.qre_next = header_pops_ps.link.qre_prev;
      header_pops_ps.justify = emitter_justify_right;
      header_pops_ps.width = 8;
      header_pops_ps.type = emitter_type_title;
      header_pops_ps.field_3.str_val = "(#/sec)";
      col_failed_push.link.qre_prev = &col_failed_push;
      if (col_pops_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_failed_push.link.qre_prev = ((col_pops_ps.link.qre_prev)->link).qre_prev;
        ((col_pops_ps.link.qre_prev)->link).qre_prev = &col_failed_push;
        ((((col_pops_ps.link.qre_next)->link).qre_prev)->link).qre_next = col_pops_ps.link.qre_next;
        ((col_failed_push.link.qre_prev)->link).qre_next = &col_failed_push;
      }
      col_failed_push.link.qre_next = col_failed_push.link.qre_prev;
      col_failed_push.justify = emitter_justify_right;
      col_failed_push.width = 0xd;
      col_failed_push.type = emitter_type_uint64;
      header_failed_push.link.qre_prev = &header_failed_push;
      if (header_pops_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_failed_push.link.qre_prev = ((header_pops_ps.link.qre_prev)->link).qre_prev;
        ((header_pops_ps.link.qre_prev)->link).qre_prev = &header_failed_push;
        ((((header_pops_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_pops_ps.link.qre_next;
        ((header_failed_push.link.qre_prev)->link).qre_next = &header_failed_push;
      }
      header_failed_push.link.qre_next = header_failed_push.link.qre_prev;
      header_failed_push.justify = emitter_justify_right;
      header_failed_push.width = 0xd;
      header_failed_push.type = emitter_type_title;
      header_failed_push.field_3.str_val = "failed_push";
      col_failed_push_ps.link.qre_prev = &col_failed_push_ps;
      if (col_failed_push.link.qre_prev != (emitter_col_t *)0x0) {
        col_failed_push_ps.link.qre_prev = ((col_failed_push.link.qre_prev)->link).qre_prev;
        ((col_failed_push.link.qre_prev)->link).qre_prev = &col_failed_push_ps;
        ((((col_failed_push.link.qre_next)->link).qre_prev)->link).qre_next =
             col_failed_push.link.qre_next;
        ((col_failed_push_ps.link.qre_prev)->link).qre_next = &col_failed_push_ps;
      }
      col_failed_push_ps.link.qre_next = col_failed_push_ps.link.qre_prev;
      col_failed_push_ps.justify = emitter_justify_right;
      col_failed_push_ps.width = 8;
      col_failed_push_ps.type = emitter_type_uint64;
      header_failed_push_ps.link.qre_prev = &header_failed_push_ps;
      if (header_failed_push.link.qre_prev != (emitter_col_t *)0x0) {
        header_failed_push_ps.link.qre_prev = ((header_failed_push.link.qre_prev)->link).qre_prev;
        ((header_failed_push.link.qre_prev)->link).qre_prev = &header_failed_push_ps;
        ((((header_failed_push.link.qre_next)->link).qre_prev)->link).qre_next =
             header_failed_push.link.qre_next;
        ((header_failed_push_ps.link.qre_prev)->link).qre_next = &header_failed_push_ps;
      }
      header_failed_push_ps.link.qre_next = header_failed_push_ps.link.qre_prev;
      header_failed_push_ps.justify = emitter_justify_right;
      header_failed_push_ps.width = 8;
      header_failed_push_ps.type = emitter_type_title;
      header_failed_push_ps.field_3.str_val = "(#/sec)";
      col_push.link.qre_prev = &col_push;
      if (col_failed_push_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_push.link.qre_prev = ((col_failed_push_ps.link.qre_prev)->link).qre_prev;
        ((col_failed_push_ps.link.qre_prev)->link).qre_prev = &col_push;
        ((((col_failed_push_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_failed_push_ps.link.qre_next;
        ((col_push.link.qre_prev)->link).qre_next = &col_push;
      }
      col_push.link.qre_next = col_push.link.qre_prev;
      col_push.justify = emitter_justify_right;
      col_push.width = 7;
      col_push.type = emitter_type_uint64;
      header_push.link.qre_prev = &header_push;
      if (header_failed_push_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_push.link.qre_prev = ((header_failed_push_ps.link.qre_prev)->link).qre_prev;
        ((header_failed_push_ps.link.qre_prev)->link).qre_prev = &header_push;
        ((((header_failed_push_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_failed_push_ps.link.qre_next;
        ((header_push.link.qre_prev)->link).qre_next = &header_push;
      }
      header_push.link.qre_next = header_push.link.qre_prev;
      header_push.justify = emitter_justify_right;
      header_push.width = 7;
      header_push.type = emitter_type_title;
      header_push.field_3.str_val = "push";
      col_push_ps.link.qre_prev = &col_push_ps;
      if (col_push.link.qre_prev != (emitter_col_t *)0x0) {
        col_push_ps.link.qre_prev = ((col_push.link.qre_prev)->link).qre_prev;
        ((col_push.link.qre_prev)->link).qre_prev = &col_push_ps;
        ((((col_push.link.qre_next)->link).qre_prev)->link).qre_next = col_push.link.qre_next;
        ((col_push_ps.link.qre_prev)->link).qre_next = &col_push_ps;
      }
      col_push_ps.link.qre_next = col_push_ps.link.qre_prev;
      col_push_ps.justify = emitter_justify_right;
      col_push_ps.width = 8;
      col_push_ps.type = emitter_type_uint64;
      header_push_ps.link.qre_prev = &header_push_ps;
      if (header_push.link.qre_prev != (emitter_col_t *)0x0) {
        header_push_ps.link.qre_prev = ((header_push.link.qre_prev)->link).qre_prev;
        ((header_push.link.qre_prev)->link).qre_prev = &header_push_ps;
        ((((header_push.link.qre_next)->link).qre_prev)->link).qre_next = header_push.link.qre_next;
        ((header_push_ps.link.qre_prev)->link).qre_next = &header_push_ps;
      }
      header_push_ps.link.qre_next = header_push_ps.link.qre_prev;
      header_push_ps.justify = emitter_justify_right;
      header_push_ps.width = 8;
      header_push_ps.type = emitter_type_title;
      header_push_ps.field_3.str_val = "(#/sec)";
      col_push_elem.link.qre_prev = &col_push_elem;
      if (col_push_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_push_elem.link.qre_prev = ((col_push_ps.link.qre_prev)->link).qre_prev;
        ((col_push_ps.link.qre_prev)->link).qre_prev = &col_push_elem;
        ((((col_push_ps.link.qre_next)->link).qre_prev)->link).qre_next = col_push_ps.link.qre_next;
        ((col_push_elem.link.qre_prev)->link).qre_next = &col_push_elem;
      }
      col_push_elem.link.qre_next = col_push_elem.link.qre_prev;
      col_push_elem.justify = emitter_justify_right;
      col_push_elem.width = 0xc;
      col_push_elem.type = emitter_type_uint64;
      header_push_elem.link.qre_prev = &header_push_elem;
      if (header_push_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_push_elem.link.qre_prev = ((header_push_ps.link.qre_prev)->link).qre_prev;
        ((header_push_ps.link.qre_prev)->link).qre_prev = &header_push_elem;
        ((((header_push_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_push_ps.link.qre_next;
        ((header_push_elem.link.qre_prev)->link).qre_next = &header_push_elem;
      }
      header_push_elem.link.qre_next = header_push_elem.link.qre_prev;
      header_push_elem.justify = emitter_justify_right;
      header_push_elem.width = 0xc;
      header_push_elem.type = emitter_type_title;
      header_push_elem.field_3.str_val = "push_elem";
      col_push_elem_ps.link.qre_prev = &col_push_elem_ps;
      if (col_push_elem.link.qre_prev != (emitter_col_t *)0x0) {
        col_push_elem_ps.link.qre_prev = ((col_push_elem.link.qre_prev)->link).qre_prev;
        ((col_push_elem.link.qre_prev)->link).qre_prev = &col_push_elem_ps;
        ((((col_push_elem.link.qre_next)->link).qre_prev)->link).qre_next =
             col_push_elem.link.qre_next;
        ((col_push_elem_ps.link.qre_prev)->link).qre_next = &col_push_elem_ps;
      }
      row.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)
           (anon_struct_8_1_803fbc3e_for_cols)col_push_elem_ps.link.qre_prev;
      col_push_elem_ps.justify = emitter_justify_right;
      col_push_elem_ps.width = 8;
      col_push_elem_ps.type = emitter_type_uint64;
      header_push_elem_ps.link.qre_prev = &header_push_elem_ps;
      if (header_push_elem.link.qre_prev != (emitter_col_t *)0x0) {
        header_push_elem_ps.link.qre_prev = ((header_push_elem.link.qre_prev)->link).qre_prev;
        ((header_push_elem.link.qre_prev)->link).qre_prev = &header_push_elem_ps;
        ((((header_push_elem.link.qre_next)->link).qre_prev)->link).qre_next =
             header_push_elem.link.qre_next;
        ((header_push_elem_ps.link.qre_prev)->link).qre_next = &header_push_elem_ps;
      }
      header_row.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)
           (anon_struct_8_1_803fbc3e_for_cols)header_push_elem_ps.link.qre_prev;
      header_push_elem_ps.justify = emitter_justify_right;
      header_push_elem_ps.width = 8;
      header_push_elem_ps.type = emitter_type_title;
      header_push_elem_ps.field_3.str_val = "(#/sec)";
      header_justify_spacer.field_3.str_val = " ";
      col_justify_spacer.field_3.str_val = " ";
      header_push_elem_ps.link.qre_next = header_push_elem_ps.link.qre_prev;
      col_push_elem_ps.link.qre_next = col_push_elem_ps.link.qre_prev;
      if ((char)local_f1c != '\0') {
        mutex_stats_init_cols(&row,(char *)0x0,(emitter_col_t *)0x0,col_mutex64,col_mutex32);
        mutex_stats_init_cols
                  (&header_row,(char *)0x0,(emitter_col_t *)0x0,header_mutex64,header_mutex32);
      }
      header_size.width = header_size.width + -5;
      emitter_table_printf(emitter,"bins:");
      eVar6 = header_row;
      if (emitter->output == emitter_output_table) {
        if (header_row.cols.qlh_first != (emitter_col_t *)0x0) {
          eVar17 = header_row;
          do {
            emitter_print_value(emitter,((emitter_col_t *)eVar17.cols.qlh_first)->justify,
                                ((emitter_col_t *)eVar17.cols.qlh_first)->width,
                                ((emitter_col_t *)eVar17.cols.qlh_first)->type,
                                &((emitter_col_t *)eVar17.cols.qlh_first)->field_3);
            eVar17.cols.qlh_first =
                 (anon_struct_8_1_803fbc3e_for_cols)
                 (((emitter_col_t *)eVar17.cols.qlh_first)->link).qre_next;
            if (eVar17.cols.qlh_first == eVar6.cols.qlh_first) {
              eVar17.cols.qlh_first =
                   (anon_struct_8_1_803fbc3e_for_cols)
                   (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x0;
            }
          } while (eVar17.cols.qlh_first != (emitter_col_t *)0x0);
        }
        emitter_table_printf(emitter,anon_var_dwarf_647c26b + 8);
      }
      emitter_json_array_kv_begin(emitter,"bins");
      arenas_bin_mib[0] = 7;
      lVar1 = *in_FS_OFFSET;
      tsd = (tsd_t *)(lVar1 + -0x2a90);
      ptVar12 = tsd;
      if (*(char *)(lVar1 + -0x2758) != '\0') {
        ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      iVar9 = duckdb_je_ctl_mibnametomib(ptVar12,stats_arenas_mib,0,"stats.arenas",arenas_bin_mib);
      if (iVar9 == 0) {
        stats_arenas_mib[2] = (size_t)i;
        arenas_bin_mib[0] = 7;
        ptVar12 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar9 = duckdb_je_ctl_mibnametomib(ptVar12,stats_arenas_mib,3,"bins",arenas_bin_mib);
        if (iVar9 == 0) {
          miblen_new_2 = 7;
          ptVar12 = tsd;
          if (*(char *)(lVar1 + -0x2758) != '\0') {
            ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
          }
          iVar9 = duckdb_je_ctl_mibnametomib(ptVar12,arenas_bin_mib,0,"arenas.bin",&miblen_new_2);
          if (iVar9 == 0) {
            if (nbins == 0) {
              cVar13 = '\0';
            }
            else {
              uptime_s = uptime / 1000000000;
              uVar16 = 0;
              uVar18 = 0;
              do {
                miblen_new_2 = 7;
                sz_2 = 8;
                ptVar12 = tsd;
                stats_arenas_mib[4] = uVar16;
                arenas_bin_mib[2] = uVar16;
                if (*(char *)(lVar1 + -0x2758) != '\0') {
                  ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                pcVar14 = "nslabs";
                iVar9 = duckdb_je_ctl_bymibname
                                  (ptVar12,stats_arenas_mib,5,"nslabs",&miblen_new_2,&nslabs,&sz_2,
                                   (void *)0x0,0);
                uVar7 = nslabs;
                if (iVar9 != 0) goto LAB_00206d9d;
                uVar15 = CONCAT71((int7)((ulong)pcVar14 >> 8),nslabs == 0);
                if ((~(byte)uVar18 & 1) == 0 && nslabs != 0) {
                  uVar15 = uVar15 & 0xffffffff;
                  emitter_table_printf(emitter,"                     ---\n");
                }
                if ((uVar7 != 0) || (emitter->output < emitter_output_table)) {
                  local_f00 = (uint)uVar15;
                  miblen_new_2 = 7;
                  sz_2 = 8;
                  ptVar12 = tsd;
                  if (*(char *)(lVar1 + -0x2758) != '\0') {
                    ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                  }
                  iVar9 = duckdb_je_ctl_bymibname
                                    (ptVar12,arenas_bin_mib,3,"size",&miblen_new_2,&reg_size,&sz_2,
                                     (void *)0x0,0);
                  if (iVar9 == 0) {
                    miblen_new_2 = 7;
                    sz_2 = 4;
                    ptVar12 = tsd;
                    if (*(char *)(lVar1 + -0x2758) != '\0') {
                      ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                    }
                    iVar9 = duckdb_je_ctl_bymibname
                                      (ptVar12,arenas_bin_mib,3,"nregs",&miblen_new_2,&nregs,&sz_2,
                                       (void *)0x0,0);
                    if (iVar9 == 0) {
                      miblen_new_2 = 7;
                      sz_2 = 8;
                      ptVar12 = tsd;
                      if (*(char *)(lVar1 + -0x2758) != '\0') {
                        ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                      }
                      iVar9 = duckdb_je_ctl_bymibname
                                        (ptVar12,arenas_bin_mib,3,"slab_size",&miblen_new_2,
                                         &slab_size,&sz_2,(void *)0x0,0);
                      if (iVar9 == 0) {
                        miblen_new_2 = 7;
                        sz_2 = 4;
                        ptVar12 = tsd;
                        if (*(char *)(lVar1 + -0x2758) != '\0') {
                          ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                        }
                        iVar9 = duckdb_je_ctl_bymibname
                                          (ptVar12,arenas_bin_mib,3,"nshards",&miblen_new_2,&nshards
                                           ,&sz_2,(void *)0x0,0);
                        if (iVar9 == 0) {
                          miblen_new_2 = 7;
                          sz_2 = 8;
                          ptVar12 = tsd;
                          if (*(char *)(lVar1 + -0x2758) != '\0') {
                            ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                          }
                          iVar9 = duckdb_je_ctl_bymibname
                                            (ptVar12,stats_arenas_mib,5,"nmalloc",&miblen_new_2,
                                             &nmalloc,&sz_2,(void *)0x0,0);
                          if (iVar9 == 0) {
                            miblen_new_2 = 7;
                            sz_2 = 8;
                            ptVar12 = tsd;
                            if (*(char *)(lVar1 + -0x2758) != '\0') {
                              ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                            }
                            iVar9 = duckdb_je_ctl_bymibname
                                              (ptVar12,stats_arenas_mib,5,"ndalloc",&miblen_new_2,
                                               &ndalloc,&sz_2,(void *)0x0,0);
                            if (iVar9 == 0) {
                              miblen_new_2 = 7;
                              sz_2 = 8;
                              ptVar12 = tsd;
                              if (*(char *)(lVar1 + -0x2758) != '\0') {
                                ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                              }
                              iVar9 = duckdb_je_ctl_bymibname
                                                (ptVar12,stats_arenas_mib,5,"curregs",&miblen_new_2,
                                                 &curregs,&sz_2,(void *)0x0,0);
                              if (iVar9 == 0) {
                                miblen_new_2 = 7;
                                sz_2 = 8;
                                ptVar12 = tsd;
                                if (*(char *)(lVar1 + -0x2758) != '\0') {
                                  ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                }
                                iVar9 = duckdb_je_ctl_bymibname
                                                  (ptVar12,stats_arenas_mib,5,"nrequests",
                                                   &miblen_new_2,&nrequests,&sz_2,(void *)0x0,0);
                                if (iVar9 == 0) {
                                  miblen_new_2 = 7;
                                  sz_2 = 8;
                                  ptVar12 = tsd;
                                  if (*(char *)(lVar1 + -0x2758) != '\0') {
                                    ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                  }
                                  iVar9 = duckdb_je_ctl_bymibname
                                                    (ptVar12,stats_arenas_mib,5,"nfills",
                                                     &miblen_new_2,&nfills,&sz_2,(void *)0x0,0);
                                  if (iVar9 == 0) {
                                    miblen_new_2 = 7;
                                    sz_2 = 8;
                                    ptVar12 = tsd;
                                    if (*(char *)(lVar1 + -0x2758) != '\0') {
                                      ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                    }
                                    iVar9 = duckdb_je_ctl_bymibname
                                                      (ptVar12,stats_arenas_mib,5,"nflushes",
                                                       &miblen_new_2,&nflushes,&sz_2,(void *)0x0,0);
                                    if (iVar9 == 0) {
                                      miblen_new_2 = 7;
                                      sz_2 = 8;
                                      ptVar12 = tsd;
                                      if (*(char *)(lVar1 + -0x2758) != '\0') {
                                        ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                      }
                                      iVar9 = duckdb_je_ctl_bymibname
                                                        (ptVar12,stats_arenas_mib,5,"nreslabs",
                                                         &miblen_new_2,&nreslabs,&sz_2,(void *)0x0,0
                                                        );
                                      if (iVar9 == 0) {
                                        miblen_new_2 = 7;
                                        sz_2 = 8;
                                        ptVar12 = tsd;
                                        if (*(char *)(lVar1 + -0x2758) != '\0') {
                                          ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                        }
                                        iVar9 = duckdb_je_ctl_bymibname
                                                          (ptVar12,stats_arenas_mib,5,"curslabs",
                                                           &miblen_new_2,&curslabs,&sz_2,(void *)0x0
                                                           ,0);
                                        if (iVar9 == 0) {
                                          miblen_new_2 = 7;
                                          sz_2 = 8;
                                          ptVar12 = tsd;
                                          if (*(char *)(lVar1 + -0x2758) != '\0') {
                                            ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                          }
                                          iVar9 = duckdb_je_ctl_bymibname
                                                            (ptVar12,stats_arenas_mib,5,
                                                             "nonfull_slabs",&miblen_new_2,
                                                             &nonfull_slabs,&sz_2,(void *)0x0,0);
                                          if (iVar9 == 0) {
                                            miblen_new_2 = 7;
                                            sz_2 = 8;
                                            ptVar12 = tsd;
                                            if (*(char *)(lVar1 + -0x2758) != '\0') {
                                              ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                            }
                                            iVar9 = duckdb_je_ctl_bymibname
                                                              (ptVar12,stats_arenas_mib,5,
                                                               "batch_pops",&miblen_new_2,
                                                               &batch_pops,&sz_2,(void *)0x0,0);
                                            if (iVar9 == 0) {
                                              miblen_new_2 = 7;
                                              sz_2 = 8;
                                              ptVar12 = tsd;
                                              if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                              }
                                              iVar9 = duckdb_je_ctl_bymibname
                                                                (ptVar12,stats_arenas_mib,5,
                                                                 "batch_failed_pushes",&miblen_new_2
                                                                 ,&batch_failed_pushes,&sz_2,
                                                                 (void *)0x0,0);
                                              if (iVar9 == 0) {
                                                miblen_new_2 = 7;
                                                sz_2 = 8;
                                                ptVar12 = tsd;
                                                if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                  ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                }
                                                iVar9 = duckdb_je_ctl_bymibname
                                                                  (ptVar12,stats_arenas_mib,5,
                                                                   "batch_pushes",&miblen_new_2,
                                                                   &batch_pushes,&sz_2,(void *)0x0,0
                                                                  );
                                                if (iVar9 == 0) {
                                                  miblen_new_2 = 7;
                                                  sz_2 = 8;
                                                  ptVar12 = tsd;
                                                  if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                    ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                  }
                                                  iVar9 = duckdb_je_ctl_bymibname
                                                                    (ptVar12,stats_arenas_mib,5,
                                                                     "batch_pushed_elems",
                                                                     &miblen_new_2,
                                                                     &batch_pushed_elems,&sz_2,
                                                                     (void *)0x0,0);
                                                  if (iVar9 == 0) {
                                                    if ((char)local_f1c == '\0') {
LAB_0020633b:
                                                      local_e58 = uVar16;
                                                      if (emitter->output < emitter_output_table) {
                                                        if (emitter->emitted_key == true) {
                                                          emitter->emitted_key = false;
                                                        }
                                                        else {
                                                          if (emitter->item_at_depth == true) {
                                                            emitter_printf(emitter,",");
                                                          }
                                                          if (emitter->output !=
                                                              emitter_output_json_compact) {
                                                            emitter_printf(emitter,
                                                  anon_var_dwarf_647c26b + 8);
                                                  pcVar14 = anon_var_dwarf_647c64c + 7;
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar14 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar9 = emitter->nesting_depth <<
                                                            (emitter->output != emitter_output_json)
                                                    ;
                                                    if (iVar9 < 2) {
                                                      iVar9 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar14);
                                                      iVar9 = iVar9 + -1;
                                                    } while (iVar9 != 0);
                                                  }
                                                  }
                                                  }
                                                  emitter_printf(emitter,"{");
                                                  emitter->nesting_depth =
                                                       emitter->nesting_depth + 1;
                                                  emitter->item_at_depth = false;
                                                  }
                                                  emitter_json_kv(emitter,"nmalloc",
                                                                  emitter_type_uint64,&nmalloc);
                                                  emitter_json_kv(emitter,"ndalloc",
                                                                  emitter_type_uint64,&ndalloc);
                                                  emitter_json_kv(emitter,"curregs",
                                                                  emitter_type_size,&curregs);
                                                  emitter_json_kv(emitter,"nrequests",
                                                                  emitter_type_uint64,&nrequests);
                                                  emitter_json_kv(emitter,"nfills",
                                                                  emitter_type_uint64,&nfills);
                                                  emitter_json_kv(emitter,"nflushes",
                                                                  emitter_type_uint64,&nflushes);
                                                  emitter_json_kv(emitter,"nreslabs",
                                                                  emitter_type_uint64,&nreslabs);
                                                  emitter_json_kv(emitter,"curslabs",
                                                                  emitter_type_size,&curslabs);
                                                  emitter_json_kv(emitter,"nonfull_slabs",
                                                                  emitter_type_size,&nonfull_slabs);
                                                  emitter_json_kv(emitter,"batch_pops",
                                                                  emitter_type_uint64,&batch_pops);
                                                  emitter_json_kv(emitter,"batch_failed_pushes",
                                                                  emitter_type_uint64,
                                                                  &batch_failed_pushes);
                                                  emitter_json_kv(emitter,"batch_pushes",
                                                                  emitter_type_uint64,&batch_pushes)
                                                  ;
                                                  emitter_json_kv(emitter,"batch_pushed_elems",
                                                                  emitter_type_uint64,
                                                                  &batch_pushed_elems);
                                                  if ((char)local_f1c != '\0') {
                                                    emitter_json_object_kv_begin(emitter,"mutex");
                                                    mutex_stats_emit(emitter,(emitter_row_t *)0x0,
                                                                     col_mutex64,col_mutex32);
                                                    if (emitter->output < emitter_output_table) {
                                                      emitter->nesting_depth =
                                                           emitter->nesting_depth + -1;
                                                      emitter->item_at_depth = true;
                                                      if (emitter->output !=
                                                          emitter_output_json_compact) {
                                                        emitter_printf(emitter,
                                                  anon_var_dwarf_647c26b + 8);
                                                  pcVar14 = anon_var_dwarf_647c64c + 7;
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar14 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar9 = emitter->nesting_depth <<
                                                            (emitter->output != emitter_output_json)
                                                    ;
                                                    if (iVar9 < 2) {
                                                      iVar9 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar14);
                                                      iVar9 = iVar9 + -1;
                                                    } while (iVar9 != 0);
                                                  }
                                                  }
                                                  emitter_printf(emitter,"}");
                                                  }
                                                  }
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_647c26b
                                                                             + 8);
                                                      pcVar14 = anon_var_dwarf_647c64c + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar14 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar9 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar9 < 2) {
                                                          iVar9 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar14);
                                                          iVar9 = iVar9 + -1;
                                                        } while (iVar9 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  uVar16 = local_e58;
                                                  uVar18 = nregs * curslabs;
                                                  bVar3 = uVar18 < curregs;
                                                  if (bVar3 || uVar18 == 0) {
LAB_002066e8:
                                                    pcVar14 = " race";
                                                    if (uVar18 == 0) {
                                                      pcVar14 = "1";
                                                    }
                                                    duckdb_je_malloc_snprintf
                                                              ((char *)&miblen_new_2,6,pcVar14);
                                                  }
                                                  else {
                                                    auVar4._8_8_ = 0;
                                                    auVar4._0_8_ = uVar18;
                                                    auVar5._8_8_ = 0;
                                                    auVar5._0_8_ = curregs * 1000;
                                                    uVar10 = SUB164(auVar5 / auVar4,0);
                                                    if (uVar10 < 10) {
                                                      pcVar14 = "0.00%u";
LAB_002066da:
                                                      duckdb_je_malloc_snprintf
                                                                ((char *)&miblen_new_2,6,pcVar14,
                                                                 SUB168(auVar5 / auVar4,0) &
                                                                 0xffffffff);
                                                    }
                                                    else {
                                                      if (uVar10 < 100) {
                                                        pcVar14 = "0.0%u";
                                                        goto LAB_002066da;
                                                      }
                                                      if (uVar10 < 1000) {
                                                        pcVar14 = "0.%u";
                                                        goto LAB_002066da;
                                                      }
                                                      duckdb_je_malloc_snprintf
                                                                ((char *)&miblen_new_2,6,"1");
                                                    }
                                                    if (bVar3 || uVar18 == 0) goto LAB_002066e8;
                                                  }
                                                  eVar6.cols.qlh_first = row.cols.qlh_first;
                                                  col_allocated.field_3.uint64_val =
                                                       curregs * reg_size;
                                                  col_size.field_3.size_val = reg_size;
                                                  col_ind.field_3.int_val = (int)uVar16;
                                                  col_nmalloc.field_3.uint64_val = nmalloc;
                                                  col_nmalloc_ps.field_3.uint64_val = nmalloc;
                                                  if (uptime == 0) {
                                                    col_nmalloc_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nmalloc != 0 && 999999999 < uptime) {
                                                    col_nmalloc_ps.field_3.uint64_val =
                                                         nmalloc / uptime_s;
                                                  }
                                                  col_ndalloc.field_3.uint64_val = ndalloc;
                                                  col_ndalloc_ps.field_3.uint64_val = ndalloc;
                                                  if (uptime == 0) {
                                                    col_ndalloc_ps.field_3.uint64_val = 0;
                                                  }
                                                  col_util.field_3.str_val = (char *)&miblen_new_2;
                                                  if (ndalloc != 0 && 999999999 < uptime) {
                                                    col_ndalloc_ps.field_3.uint64_val =
                                                         ndalloc / uptime_s;
                                                  }
                                                  col_nrequests.field_3.uint64_val = nrequests;
                                                  col_nrequests_ps.field_3.uint64_val = nrequests;
                                                  if (uptime == 0) {
                                                    col_nrequests_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nrequests != 0 && 999999999 < uptime) {
                                                    col_nrequests_ps.field_3.uint64_val =
                                                         nrequests / uptime_s;
                                                  }
                                                  col_pgs.field_3.uint64_val = slab_size / page;
                                                  col_nshards.field_3.uint32_val = nshards;
                                                  col_curregs.field_3.size_val = curregs;
                                                  col_curslabs.field_3.size_val = curslabs;
                                                  col_nonfull_slabs.field_3.size_val = nonfull_slabs
                                                  ;
                                                  col_regs.field_3.uint32_val = nregs;
                                                  col_nfills.field_3.uint64_val = nfills;
                                                  col_nfills_ps.field_3.uint64_val = nfills;
                                                  if (uptime == 0) {
                                                    col_nfills_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nfills != 0 && 999999999 < uptime) {
                                                    col_nfills_ps.field_3.uint64_val =
                                                         nfills / uptime_s;
                                                  }
                                                  col_nflushes.field_3.uint64_val = nflushes;
                                                  col_nflushes_ps.field_3.uint64_val = nflushes;
                                                  if (uptime == 0) {
                                                    col_nflushes_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nflushes != 0 && 999999999 < uptime) {
                                                    col_nflushes_ps.field_3.uint64_val =
                                                         nflushes / uptime_s;
                                                  }
                                                  col_nslabs.field_3.uint64_val = nslabs;
                                                  col_nreslabs.field_3.uint64_val = nreslabs;
                                                  col_nreslabs_ps.field_3.uint64_val = nreslabs;
                                                  if (uptime == 0) {
                                                    col_nreslabs_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (nreslabs != 0 && 999999999 < uptime) {
                                                    col_nreslabs_ps.field_3.uint64_val =
                                                         nreslabs / uptime_s;
                                                  }
                                                  col_pops.field_3.uint64_val = batch_pops;
                                                  col_pops_ps.field_3.uint64_val = batch_pops;
                                                  if (uptime == 0) {
                                                    col_pops_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_pops != 0 && 999999999 < uptime) {
                                                    col_pops_ps.field_3.uint64_val =
                                                         batch_pops / uptime_s;
                                                  }
                                                  col_failed_push.field_3.uint64_val =
                                                       batch_failed_pushes;
                                                  col_failed_push_ps.field_3.uint64_val =
                                                       batch_failed_pushes;
                                                  if (uptime == 0) {
                                                    col_failed_push_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_failed_pushes != 0 && 999999999 < uptime
                                                     ) {
                                                    col_failed_push_ps.field_3.uint64_val =
                                                         batch_failed_pushes / uptime_s;
                                                  }
                                                  col_push.field_3.uint64_val = batch_pushes;
                                                  col_push_ps.field_3.uint64_val = batch_pushes;
                                                  if (uptime == 0) {
                                                    col_push_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_pushes != 0 && 999999999 < uptime) {
                                                    col_push_ps.field_3.uint64_val =
                                                         batch_pushes / uptime_s;
                                                  }
                                                  col_push_elem.field_3.uint64_val =
                                                       batch_pushed_elems;
                                                  col_push_elem_ps.field_3.uint64_val =
                                                       batch_pushed_elems;
                                                  if (uptime == 0) {
                                                    col_push_elem_ps.field_3.uint64_val = 0;
                                                  }
                                                  if (batch_pushed_elems != 0 && 999999999 < uptime)
                                                  {
                                                    col_push_elem_ps.field_3.uint64_val =
                                                         batch_pushed_elems / uptime_s;
                                                  }
                                                  eVar17.cols.qlh_first = row.cols.qlh_first;
                                                  if (emitter->output == emitter_output_table) {
                                                    while (eVar17.cols.qlh_first !=
                                                           (emitter_col_t *)0x0) {
                                                      emitter_print_value(emitter,((emitter_col_t *)
                                                                                  eVar17.cols.
                                                                                  qlh_first)->
                                                                                  justify,
                                                                          ((emitter_col_t *)
                                                                          eVar17.cols.qlh_first)->
                                                                          width,((emitter_col_t *)
                                                                                eVar17.cols.
                                                                                qlh_first)->type,
                                                                          &((emitter_col_t *)
                                                                           eVar17.cols.qlh_first)->
                                                                           field_3);
                                                      aVar2.qlh_first =
                                                           (((emitter_col_t *)eVar17.cols.qlh_first)
                                                           ->link).qre_next;
                                                      eVar17.cols.qlh_first =
                                                           (anon_struct_8_1_803fbc3e_for_cols)
                                                           (anon_struct_8_1_803fbc3e_for_cols)
                                                           (emitter_col_t *)0x0;
                                                      if ((anon_struct_8_1_803fbc3e_for_cols)
                                                          aVar2.qlh_first != eVar6.cols.qlh_first) {
                                                        eVar17.cols.qlh_first =
                                                             (anon_struct_8_1_803fbc3e_for_cols)
                                                             (anon_struct_8_1_803fbc3e_for_cols)
                                                             aVar2.qlh_first;
                                                      }
                                                    }
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_647c26b + 8);
                                                  }
                                                  uVar15 = (ulong)local_f00;
                                                  goto LAB_00206abc;
                                                  }
                                                  miblen_new_2 = 7;
                                                  ptVar12 = tsd;
                                                  if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                    ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                  }
                                                  iVar9 = duckdb_je_ctl_mibnametomib
                                                                    (ptVar12,stats_arenas_mib,5,
                                                                     "mutex",&miblen_new_2);
                                                  if (iVar9 != 0) goto LAB_00206dae;
                                                  col_mutex64[0].type = emitter_type_uint64;
                                                  miblen_new_2 = 7;
                                                  sz_2 = 8;
                                                  ptVar12 = tsd;
                                                  if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                    ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                  }
                                                  iVar9 = duckdb_je_ctl_bymibname
                                                                    (ptVar12,stats_arenas_mib,6,
                                                                     "num_ops",&miblen_new_2,
                                                                     &col_mutex64[0].field_3,&sz_2,
                                                                     (void *)0x0,0);
                                                  if (iVar9 == 0) {
                                                    col_mutex64[1].type = emitter_type_uint64;
                                                    col_mutex64[1].field_3 = col_mutex64[0].field_3;
                                                    if (uptime == 0) {
                                                      col_mutex64[1].field_3.uint64_val = 0;
                                                    }
                                                    if (col_mutex64[0].field_3.uint64_val != 0 &&
                                                        999999999 < uptime) {
                                                      col_mutex64[1].field_3.uint64_val =
                                                           col_mutex64[0].field_3.uint64_val /
                                                           uptime_s;
                                                    }
                                                    col_mutex64[2].type = emitter_type_uint64;
                                                    miblen_new_2 = 7;
                                                    sz_2 = 8;
                                                    ptVar12 = tsd;
                                                    if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                      ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                    }
                                                    iVar9 = duckdb_je_ctl_bymibname
                                                                      (ptVar12,stats_arenas_mib,6,
                                                                       "num_wait",&miblen_new_2,
                                                                       &col_mutex64[2].field_3,&sz_2
                                                                       ,(void *)0x0,0);
                                                    if (iVar9 == 0) {
                                                      col_mutex64[3].type = emitter_type_uint64;
                                                      col_mutex64[3].field_3 =
                                                           col_mutex64[2].field_3;
                                                      if (uptime == 0) {
                                                        col_mutex64[3].field_3.uint64_val = 0;
                                                      }
                                                      if (col_mutex64[2].field_3.uint64_val != 0 &&
                                                          999999999 < uptime) {
                                                        col_mutex64[3].field_3.uint64_val =
                                                             col_mutex64[2].field_3.uint64_val /
                                                             uptime_s;
                                                      }
                                                      col_mutex64[4].type = emitter_type_uint64;
                                                      miblen_new_2 = 7;
                                                      sz_2 = 8;
                                                      ptVar12 = tsd;
                                                      if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                        ptVar12 = duckdb_je_tsd_fetch_slow
                                                                            (tsd,false);
                                                      }
                                                      iVar9 = duckdb_je_ctl_bymibname
                                                                        (ptVar12,stats_arenas_mib,6,
                                                                         "num_spin_acq",
                                                                         &miblen_new_2,
                                                                         &col_mutex64[4].field_3,
                                                                         &sz_2,(void *)0x0,0);
                                                      if (iVar9 == 0) {
                                                        col_mutex64[5].type = emitter_type_uint64;
                                                        col_mutex64[5].field_3 =
                                                             col_mutex64[4].field_3;
                                                        if (uptime == 0) {
                                                          col_mutex64[5].field_3.uint64_val = 0;
                                                        }
                                                        if (col_mutex64[4].field_3.uint64_val != 0
                                                            && 999999999 < uptime) {
                                                          col_mutex64[5].field_3.uint64_val =
                                                               col_mutex64[4].field_3.uint64_val /
                                                               uptime_s;
                                                        }
                                                        col_mutex64[6].type = emitter_type_uint64;
                                                        miblen_new_2 = 7;
                                                        sz_2 = 8;
                                                        ptVar12 = tsd;
                                                        if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                          ptVar12 = duckdb_je_tsd_fetch_slow
                                                                              (tsd,false);
                                                        }
                                                        iVar9 = duckdb_je_ctl_bymibname
                                                                          (ptVar12,stats_arenas_mib,
                                                                           6,"num_owner_switch",
                                                                           &miblen_new_2,
                                                                           &col_mutex64[6].field_3,
                                                                           &sz_2,(void *)0x0,0);
                                                        if (iVar9 == 0) {
                                                          col_mutex64[7].type = emitter_type_uint64;
                                                          col_mutex64[7].field_3 =
                                                               col_mutex64[6].field_3;
                                                          if (uptime == 0) {
                                                            col_mutex64[7].field_3.uint64_val = 0;
                                                          }
                                                          if (col_mutex64[6].field_3.uint64_val != 0
                                                              && 999999999 < uptime) {
                                                            col_mutex64[7].field_3.uint64_val =
                                                                 col_mutex64[6].field_3.uint64_val /
                                                                 uptime_s;
                                                          }
                                                          col_mutex64[8].type = emitter_type_uint64;
                                                          miblen_new_2 = 7;
                                                          sz_2 = 8;
                                                          ptVar12 = tsd;
                                                          if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                            ptVar12 = duckdb_je_tsd_fetch_slow
                                                                                (tsd,false);
                                                          }
                                                          iVar9 = duckdb_je_ctl_bymibname
                                                                            (ptVar12,
                                                  stats_arenas_mib,6,"total_wait_time",&miblen_new_2
                                                  ,&col_mutex64[8].field_3,&sz_2,(void *)0x0,0);
                                                  if (iVar9 == 0) {
                                                    col_mutex64[9].type = emitter_type_uint64;
                                                    col_mutex64[9].field_3 = col_mutex64[8].field_3;
                                                    if (uptime == 0) {
                                                      col_mutex64[9].field_3.uint64_val = 0;
                                                    }
                                                    if (col_mutex64[8].field_3.uint64_val != 0 &&
                                                        999999999 < uptime) {
                                                      col_mutex64[9].field_3.uint64_val =
                                                           col_mutex64[8].field_3.uint64_val /
                                                           uptime_s;
                                                    }
                                                    col_mutex64[10].type = emitter_type_uint64;
                                                    miblen_new_2 = 7;
                                                    sz_2 = 8;
                                                    ptVar12 = tsd;
                                                    if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                      ptVar12 = duckdb_je_tsd_fetch_slow(tsd,false);
                                                    }
                                                    iVar9 = duckdb_je_ctl_bymibname
                                                                      (ptVar12,stats_arenas_mib,6,
                                                                       "max_wait_time",&miblen_new_2
                                                                       ,&col_mutex64[10].field_3,
                                                                       &sz_2,(void *)0x0,0);
                                                    if (iVar9 == 0) {
                                                      col_mutex32[0].type = emitter_type_uint32;
                                                      miblen_new_2 = 7;
                                                      sz_2 = 4;
                                                      ptVar12 = tsd;
                                                      if (*(char *)(lVar1 + -0x2758) != '\0') {
                                                        ptVar12 = duckdb_je_tsd_fetch_slow
                                                                            (tsd,false);
                                                      }
                                                      iVar9 = duckdb_je_ctl_bymibname
                                                                        (ptVar12,stats_arenas_mib,6,
                                                                         "max_num_thds",
                                                                         &miblen_new_2,
                                                                         &col_mutex32[0].field_3,
                                                                         &sz_2,(void *)0x0,0);
                                                      if (iVar9 == 0) goto LAB_0020633b;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
LAB_00206d9d:
                  pcVar14 = "<jemalloc>: Failure in ctl_bymibname()\n";
                  goto LAB_00206da4;
                }
LAB_00206abc:
                cVar13 = (char)uVar15;
                uVar16 = uVar16 + 1;
                uVar18 = uVar15 & 0xffffffff;
              } while (uVar16 < nbins);
            }
            if (emitter->output < emitter_output_table) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              if (emitter->output != emitter_output_json_compact) {
                emitter_printf(emitter,anon_var_dwarf_647c26b + 8);
                pcVar14 = anon_var_dwarf_647c64c + 7;
                if (emitter->output != emitter_output_json) {
                  pcVar14 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar11 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar9 = 1;
                  if (1 < iVar11) {
                    iVar9 = iVar11;
                  }
                  do {
                    emitter_printf(emitter,"%s",pcVar14);
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                }
              }
              emitter_printf(emitter,"]");
            }
            if (cVar13 != '\0') {
              emitter_table_printf(emitter,"                     ---\n");
            }
            return;
          }
        }
      }
LAB_00206dae:
      pcVar14 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
LAB_00206da4:
      duckdb_je_malloc_write(pcVar14);
      abort();
    }
    pcVar14 = "arenas.nbins";
  }
  else {
    pcVar14 = "arenas.page";
  }
  duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",pcVar14);
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_bins_print(emitter_t *emitter, bool mutex, unsigned i,
    uint64_t uptime) {
	size_t page;
	bool in_gap, in_gap_prev;
	unsigned nbins, j;

	CTL_GET("arenas.page", &page, size_t);

	CTL_GET("arenas.nbins", &nbins, unsigned);

	emitter_row_t header_row;
	emitter_row_init(&header_row);

	emitter_row_t row;
	emitter_row_init(&row);

	bool prof_stats_on = config_prof && opt_prof && opt_prof_stats
	    && i == MALLCTL_ARENAS_ALL;

	COL_HDR(row, size, NULL, right, 20, size)
	COL_HDR(row, ind, NULL, right, 4, unsigned)
	COL_HDR(row, allocated, NULL, right, 13, size)
	COL_HDR(row, nmalloc, NULL, right, 13, uint64)
	COL_HDR(row, nmalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, ndalloc, NULL, right, 13, uint64)
	COL_HDR(row, ndalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nrequests, NULL, right, 13, uint64)
	COL_HDR(row, nrequests_ps, "(#/sec)", right, 10, uint64)
	COL_HDR_DECLARE(prof_live_requested);
	COL_HDR_DECLARE(prof_live_count);
	COL_HDR_DECLARE(prof_accum_requested);
	COL_HDR_DECLARE(prof_accum_count);
	if (prof_stats_on) {
		COL_HDR_INIT(row, prof_live_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_live_count, NULL, right, 17, uint64)
		COL_HDR_INIT(row, prof_accum_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_accum_count, NULL, right, 17, uint64)
	}
	COL_HDR(row, nshards, NULL, right, 9, unsigned)
	COL_HDR(row, curregs, NULL, right, 13, size)
	COL_HDR(row, curslabs, NULL, right, 13, size)
	COL_HDR(row, nonfull_slabs, NULL, right, 15, size)
	COL_HDR(row, regs, NULL, right, 5, unsigned)
	COL_HDR(row, pgs, NULL, right, 4, size)
	/* To buffer a right- and left-justified column. */
	COL_HDR(row, justify_spacer, NULL, right, 1, title)
	COL_HDR(row, util, NULL, right, 6, title)
	COL_HDR(row, nfills, NULL, right, 13, uint64)
	COL_HDR(row, nfills_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nflushes, NULL, right, 13, uint64)
	COL_HDR(row, nflushes_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nslabs, NULL, right, 13, uint64)
	COL_HDR(row, nreslabs, NULL, right, 13, uint64)
	COL_HDR(row, nreslabs_ps, "(#/sec)", right, 8, uint64)

	COL_HDR(row, pops, NULL, right, 10, uint64)
	COL_HDR(row, pops_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, failed_push, NULL, right, 13, uint64)
	COL_HDR(row, failed_push_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, push, NULL, right, 7, uint64)
	COL_HDR(row, push_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, push_elem, NULL, right, 12, uint64)
	COL_HDR(row, push_elem_ps, "(#/sec)", right, 8, uint64)

	/* Don't want to actually print the name. */
	header_justify_spacer.str_val = " ";
	col_justify_spacer.str_val = " ";

	emitter_col_t col_mutex64[mutex_prof_num_uint64_t_counters];
	emitter_col_t col_mutex32[mutex_prof_num_uint32_t_counters];

	emitter_col_t header_mutex64[mutex_prof_num_uint64_t_counters];
	emitter_col_t header_mutex32[mutex_prof_num_uint32_t_counters];

	if (mutex) {
		mutex_stats_init_cols(&row, NULL, NULL, col_mutex64,
		    col_mutex32);
		mutex_stats_init_cols(&header_row, NULL, NULL, header_mutex64,
		    header_mutex32);
	}

	/*
	 * We print a "bins:" header as part of the table row; we need to adjust
	 * the header size column to compensate.
	 */
	header_size.width -=5;
	emitter_table_printf(emitter, "bins:");
	emitter_table_row(emitter, &header_row);
	emitter_json_array_kv_begin(emitter, "bins");

	size_t stats_arenas_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(stats_arenas_mib, 0, "stats.arenas");
	stats_arenas_mib[2] = i;
	CTL_LEAF_PREPARE(stats_arenas_mib, 3, "bins");

	size_t arenas_bin_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(arenas_bin_mib, 0, "arenas.bin");

	size_t prof_stats_mib[CTL_MAX_DEPTH];
	if (prof_stats_on) {
		CTL_LEAF_PREPARE(prof_stats_mib, 0, "prof.stats.bins");
	}

	for (j = 0, in_gap = false; j < nbins; j++) {
		uint64_t nslabs;
		size_t reg_size, slab_size, curregs;
		size_t curslabs;
		size_t nonfull_slabs;
		uint32_t nregs, nshards;
		uint64_t nmalloc, ndalloc, nrequests, nfills, nflushes;
		uint64_t nreslabs;
		uint64_t batch_pops, batch_failed_pushes, batch_pushes,
		    batch_pushed_elems;
		prof_stats_t prof_live;
		prof_stats_t prof_accum;

		stats_arenas_mib[4] = j;
		arenas_bin_mib[2] = j;

		CTL_LEAF(stats_arenas_mib, 5, "nslabs", &nslabs, uint64_t);

		if (prof_stats_on) {
			prof_stats_mib[3] = j;
			CTL_LEAF(prof_stats_mib, 4, "live", &prof_live,
			    prof_stats_t);
			CTL_LEAF(prof_stats_mib, 4, "accum", &prof_accum,
			    prof_stats_t);
		}

		in_gap_prev = in_gap;
		if (prof_stats_on) {
			in_gap = (nslabs == 0 && prof_accum.count == 0);
		} else {
			in_gap = (nslabs == 0);
		}

		if (in_gap_prev && !in_gap) {
			emitter_table_printf(emitter,
			    "                     ---\n");
		}

		if (in_gap && !emitter_outputs_json(emitter)) {
			continue;
		}

		CTL_LEAF(arenas_bin_mib, 3, "size", &reg_size, size_t);
		CTL_LEAF(arenas_bin_mib, 3, "nregs", &nregs, uint32_t);
		CTL_LEAF(arenas_bin_mib, 3, "slab_size", &slab_size, size_t);
		CTL_LEAF(arenas_bin_mib, 3, "nshards", &nshards, uint32_t);
		CTL_LEAF(stats_arenas_mib, 5, "nmalloc", &nmalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "ndalloc", &ndalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "curregs", &curregs, size_t);
		CTL_LEAF(stats_arenas_mib, 5, "nrequests", &nrequests,
		    uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nfills", &nfills, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nflushes", &nflushes, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nreslabs", &nreslabs, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "curslabs", &curslabs, size_t);
		CTL_LEAF(stats_arenas_mib, 5, "nonfull_slabs", &nonfull_slabs,
		    size_t);

		CTL_LEAF(stats_arenas_mib, 5, "batch_pops", &batch_pops,
		    uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "batch_failed_pushes",
		    &batch_failed_pushes, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "batch_pushes",
		    &batch_pushes, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "batch_pushed_elems",
		    &batch_pushed_elems, uint64_t);

		if (mutex) {
			mutex_stats_read_arena_bin(stats_arenas_mib, 5,
			    col_mutex64, col_mutex32, uptime);
		}

		emitter_json_object_begin(emitter);
		emitter_json_kv(emitter, "nmalloc", emitter_type_uint64,
		    &nmalloc);
		emitter_json_kv(emitter, "ndalloc", emitter_type_uint64,
		    &ndalloc);
		emitter_json_kv(emitter, "curregs", emitter_type_size,
		    &curregs);
		emitter_json_kv(emitter, "nrequests", emitter_type_uint64,
		    &nrequests);
		if (prof_stats_on) {
			emitter_json_kv(emitter, "prof_live_requested",
			    emitter_type_uint64, &prof_live.req_sum);
			emitter_json_kv(emitter, "prof_live_count",
			    emitter_type_uint64, &prof_live.count);
			emitter_json_kv(emitter, "prof_accum_requested",
			    emitter_type_uint64, &prof_accum.req_sum);
			emitter_json_kv(emitter, "prof_accum_count",
			    emitter_type_uint64, &prof_accum.count);
		}
		emitter_json_kv(emitter, "nfills", emitter_type_uint64,
		    &nfills);
		emitter_json_kv(emitter, "nflushes", emitter_type_uint64,
		    &nflushes);
		emitter_json_kv(emitter, "nreslabs", emitter_type_uint64,
		    &nreslabs);
		emitter_json_kv(emitter, "curslabs", emitter_type_size,
		    &curslabs);
		emitter_json_kv(emitter, "nonfull_slabs", emitter_type_size,
		    &nonfull_slabs);
		emitter_json_kv(emitter, "batch_pops",
		    emitter_type_uint64, &batch_pops);
		emitter_json_kv(emitter, "batch_failed_pushes",
		    emitter_type_uint64, &batch_failed_pushes);
		emitter_json_kv(emitter, "batch_pushes",
		    emitter_type_uint64, &batch_pushes);
		emitter_json_kv(emitter, "batch_pushed_elems",
		    emitter_type_uint64, &batch_pushed_elems);
		if (mutex) {
			emitter_json_object_kv_begin(emitter, "mutex");
			mutex_stats_emit(emitter, NULL, col_mutex64,
			    col_mutex32);
			emitter_json_object_end(emitter);
		}
		emitter_json_object_end(emitter);

		size_t availregs = nregs * curslabs;
		char util[6];
		if (get_rate_str((uint64_t)curregs, (uint64_t)availregs, util))
		{
			if (availregs == 0) {
				malloc_snprintf(util, sizeof(util), "1");
			} else if (curregs > availregs) {
				/*
				 * Race detected: the counters were read in
				 * separate mallctl calls and concurrent
				 * operations happened in between.  In this case
				 * no meaningful utilization can be computed.
				 */
				malloc_snprintf(util, sizeof(util), " race");
			} else {
				not_reached();
			}
		}

		col_size.size_val = reg_size;
		col_ind.unsigned_val = j;
		col_allocated.size_val = curregs * reg_size;
		col_nmalloc.uint64_val = nmalloc;
		col_nmalloc_ps.uint64_val = rate_per_second(nmalloc, uptime);
		col_ndalloc.uint64_val = ndalloc;
		col_ndalloc_ps.uint64_val = rate_per_second(ndalloc, uptime);
		col_nrequests.uint64_val = nrequests;
		col_nrequests_ps.uint64_val = rate_per_second(nrequests, uptime);
		if (prof_stats_on) {
			col_prof_live_requested.uint64_val = prof_live.req_sum;
			col_prof_live_count.uint64_val = prof_live.count;
			col_prof_accum_requested.uint64_val =
			    prof_accum.req_sum;
			col_prof_accum_count.uint64_val = prof_accum.count;
		}
		col_nshards.unsigned_val = nshards;
		col_curregs.size_val = curregs;
		col_curslabs.size_val = curslabs;
		col_nonfull_slabs.size_val = nonfull_slabs;
		col_regs.unsigned_val = nregs;
		col_pgs.size_val = slab_size / page;
		col_util.str_val = util;
		col_nfills.uint64_val = nfills;
		col_nfills_ps.uint64_val = rate_per_second(nfills, uptime);
		col_nflushes.uint64_val = nflushes;
		col_nflushes_ps.uint64_val = rate_per_second(nflushes, uptime);
		col_nslabs.uint64_val = nslabs;
		col_nreslabs.uint64_val = nreslabs;
		col_nreslabs_ps.uint64_val = rate_per_second(nreslabs, uptime);

		col_pops.uint64_val = batch_pops;
		col_pops_ps.uint64_val
		    = rate_per_second(batch_pops, uptime);

		col_failed_push.uint64_val = batch_failed_pushes;
		col_failed_push_ps.uint64_val
		    = rate_per_second(batch_failed_pushes, uptime);
		col_push.uint64_val = batch_pushes;
		col_push_ps.uint64_val
		    = rate_per_second(batch_pushes, uptime);

		col_push_elem.uint64_val = batch_pushed_elems;
		col_push_elem_ps.uint64_val
		    = rate_per_second(batch_pushed_elems, uptime);

		/*
		 * Note that mutex columns were initialized above, if mutex ==
		 * true.
		 */

		emitter_table_row(emitter, &row);
	}
	emitter_json_array_end(emitter); /* Close "bins". */

	if (in_gap) {
		emitter_table_printf(emitter, "                     ---\n");
	}
}